

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O1

int __thiscall uttt::RandomPlayout::operator()(RandomPlayout *this,IBoard *game)

{
  char cVar1;
  short sVar2;
  short sVar3;
  pointer pcVar4;
  pointer pcVar5;
  result_type_conflict1 rVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  size_t __i;
  array<short,_9UL> *paVar11;
  vector<long,_std::allocator<long>_> moves;
  IMove m;
  IBoard ngame;
  param_type local_80;
  vector<long,_std::allocator<long>_> local_78;
  IMove local_60;
  IBoard local_58;
  uniform_int_distribution<int> local_38;
  
  if (operator()(uttt::IBoard_const&)::rd == '\0') {
    iVar7 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::rd);
    if (iVar7 != 0) {
      std::random_device::random_device(&operator()::rd);
      __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::rd);
    }
  }
  if (operator()(uttt::IBoard_const&)::gen == '\0') {
    iVar7 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::gen);
    if (iVar7 != 0) {
      uVar8 = std::random_device::_M_getval();
      uVar10 = (ulong)uVar8;
      lVar9 = 1;
      operator()::gen._M_x[0] = uVar10;
      do {
        uVar10 = (ulong)(((uint)(uVar10 >> 0x1e) ^ (uint)uVar10) * 0x6c078965 + (int)lVar9);
        operator()::gen._M_x[lVar9] = uVar10;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x270);
      operator()::gen._M_p = 0x270;
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::gen);
    }
  }
  local_58.macro = game->macro;
  local_58.micro._M_elems[0] = (game->micro)._M_elems[0];
  local_58.micro._M_elems[1] = (game->micro)._M_elems[1];
  local_58.micro._M_elems._4_8_ = *(undefined8 *)((game->micro)._M_elems + 2);
  local_58._16_8_ = *(undefined8 *)((game->micro)._M_elems + 6);
  cVar1 = g_macro_board_status[local_58.macro];
  if (cVar1 == '\0') {
    iVar7 = -1;
  }
  else if (cVar1 == '\x03') {
    iVar7 = 0;
  }
  else {
    iVar7 = (int)cVar1;
  }
  if (iVar7 == -1) {
    do {
      local_60 = -1;
      lVar9 = (long)local_58.next;
      if (lVar9 < 0) {
        local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (long *)0x0;
        local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (long *)0x0;
        paVar11 = &local_58.micro;
        lVar9 = 0;
        do {
          sVar2 = paVar11->_M_elems[0];
          pcVar4 = g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar5 = g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pcVar4 != pcVar5) {
            local_38._M_param._M_b = ~(uint)pcVar4 + (int)pcVar5;
            local_38._M_param._M_a = 0;
            rVar6 = std::uniform_int_distribution<int>::operator()
                              (&local_38,&operator()::gen,&local_38._M_param);
            local_80 = (param_type)
                       (long)((int)g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_start[rVar6] + (int)lVar9);
            if (local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&local_78,
                         (iterator)
                         local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long *)&local_80);
            }
            else {
              *local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish = (long)local_80;
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          lVar9 = lVar9 + 9;
          paVar11 = (array<short,_9UL> *)(paVar11->_M_elems + 1);
        } while (lVar9 != 0x51);
        local_80 = (param_type)
                   ((ulong)((int)((ulong)((long)local_78.
                                                super__Vector_base<long,_std::allocator<long>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_78.
                                               super__Vector_base<long,_std::allocator<long>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 3) - 1)
                   << 0x20);
        rVar6 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_80,&operator()::gen,&local_80);
        local_60 = local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start[rVar6];
        if (local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      else {
        sVar2 = local_58.micro._M_elems[lVar9];
        sVar3 = local_58.micro._M_elems[(byte)local_58.next];
        local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((ulong)(~*(uint *)&g_moves[sVar3].
                                                super__Vector_base<char,_std::allocator<char>_>.
                                                _M_impl.super__Vector_impl_data._M_start +
                                    *(int *)&g_moves[sVar3].
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_finish) << 0x20);
        rVar6 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_78,&operator()::gen,
                           (param_type *)&local_78);
        local_60 = (long)g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start[rVar6] + lVar9 * 9;
      }
      IBoard::ApplyMove(&local_58,&local_60);
      cVar1 = g_macro_board_status[local_58.macro];
      if (cVar1 == '\0') {
        iVar7 = -1;
      }
      else if (cVar1 == '\x03') {
        iVar7 = 0;
      }
      else {
        iVar7 = (int)cVar1;
      }
    } while (iVar7 == -1);
  }
  return iVar7;
}

Assistant:

int
RandomPlayout::operator()(const uttt::IBoard &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        game::IMove m = -1;
        if (ngame.next >= 0)
            m = ngame.next * 9 + g_moves[ngame.micro[ngame.next]][std::uniform_int_distribution<>(0, g_moves[ngame.micro[ngame.next]].size() - 1)(gen)];
        else
        {
            std::vector<game::IMove> moves;
            for (int i = 0; i < 9; i++)
                if (!g_moves[ngame.micro[i]].empty())
                    moves.push_back(i * 9 + g_moves[ngame.micro[i]][std::uniform_int_distribution<>(0, g_moves[ngame.micro[i]].size() - 1)(gen)]);
            m = moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)];
        }
        ngame.ApplyMove(m);
        status = ngame.GetStatus();
    }
    return status;
}